

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwtran.c
# Opt level: O3

void png_do_write_transformations(png_structrp png_ptr,png_row_infop row_info)

{
  png_byte pVar1;
  byte bVar2;
  png_uint_32 pVar3;
  png_bytep ppVar4;
  size_t sVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  byte *pbVar9;
  byte *pbVar10;
  ushort uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  ushort *puVar21;
  png_uint_32 istop;
  byte *pbVar22;
  png_uint_32 pVar23;
  ushort uVar24;
  uint uVar25;
  size_t sVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  int shift_start [4];
  uint local_68 [4];
  int local_58 [6];
  png_structrp local_40;
  png_row_infop local_38;
  
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  uVar18 = png_ptr->transformations;
  if (((uVar18 >> 0x14 & 1) != 0) &&
     (png_ptr->write_user_transform_fn != (png_user_transform_ptr)0x0)) {
    (*png_ptr->write_user_transform_fn)(png_ptr,row_info,png_ptr->row_buf + 1);
    uVar18 = png_ptr->transformations;
  }
  if ((short)uVar18 < 0) {
    png_do_strip_channel(row_info,png_ptr->row_buf + 1,(uint)(-1 < (char)png_ptr->flags));
    uVar18 = png_ptr->transformations;
  }
  if ((uVar18 >> 0x10 & 1) != 0) {
    png_do_packswap(row_info,png_ptr->row_buf + 1);
    uVar18 = png_ptr->transformations;
  }
  if ((((uVar18 & 4) == 0) || (row_info->bit_depth != '\b')) || (row_info->channels != '\x01'))
  goto LAB_001202bb;
  ppVar4 = png_ptr->row_buf;
  pbVar9 = ppVar4 + 1;
  pVar1 = png_ptr->bit_depth;
  pbVar22 = pbVar9;
  if (pVar1 == '\x04') {
    pVar3 = row_info->width;
    if (pVar3 != 0) {
      lVar14 = 1;
      do {
        bVar7 = ppVar4[lVar14] << 4;
        if ((png_uint_32)lVar14 == pVar3) goto LAB_0012027d;
        *pbVar22 = bVar7 | ppVar4[lVar14 + 1] & 0xf;
        pbVar22 = pbVar22 + 1;
        lVar14 = lVar14 + 2;
      } while ((int)lVar14 - pVar3 != 1);
    }
  }
  else if (pVar1 == '\x02') {
    if (row_info->width != 0) {
      iVar20 = -row_info->width;
      iVar15 = 0;
      do {
        iVar13 = 6;
        lVar14 = 0;
        uVar18 = 0;
        while( true ) {
          uVar18 = (pbVar9[lVar14] & 3) << ((byte)iVar13 & 0x1f) | uVar18;
          bVar7 = (byte)uVar18;
          if (iVar13 == 0) break;
          iVar13 = iVar13 + -2;
          lVar14 = lVar14 + 1;
          if (iVar20 + iVar15 + (int)lVar14 == 0) {
            if (iVar13 != 6) goto LAB_0012027d;
            goto LAB_00120280;
          }
        }
        *pbVar22 = bVar7;
        pbVar22 = pbVar22 + 1;
        pbVar9 = pbVar9 + lVar14 + 1;
        iVar13 = iVar15 + (int)lVar14;
        iVar15 = iVar15 + (int)lVar14 + 1;
      } while (iVar13 + iVar20 != -1);
    }
  }
  else if ((pVar1 == '\x01') && (pVar3 = row_info->width, pVar3 != 0)) {
    iVar20 = -pVar3;
    pVar23 = 0;
    do {
      uVar25 = 0x80;
      iVar15 = 0;
      uVar18 = 0;
      pbVar10 = pbVar9;
      while( true ) {
        pbVar9 = pbVar10 + 1;
        uVar19 = uVar25;
        if (*pbVar10 == 0) {
          uVar19 = 0;
        }
        uVar18 = uVar19 | uVar18;
        bVar7 = (byte)uVar18;
        if (iVar15 == -7) break;
        uVar25 = uVar25 >> 1;
        iVar15 = iVar15 + -1;
        pbVar10 = pbVar9;
        if (iVar20 == iVar15) goto LAB_0012027d;
      }
      *pbVar22 = bVar7;
      pbVar22 = pbVar22 + 1;
      pVar23 = pVar23 + 8;
      iVar20 = iVar20 + 8;
    } while (pVar23 != pVar3);
  }
LAB_00120280:
  row_info->bit_depth = pVar1;
  bVar7 = row_info->channels * pVar1;
  row_info->pixel_depth = bVar7;
  if (bVar7 < 8) {
    uVar12 = (ulong)row_info->width * (ulong)bVar7 + 7 >> 3;
  }
  else {
    uVar12 = (ulong)row_info->width * (ulong)(bVar7 >> 3);
  }
  row_info->rowbytes = uVar12;
  uVar18 = png_ptr->transformations;
LAB_001202bb:
  if ((uVar18 & 0x10) != 0) {
    png_do_swap(row_info,png_ptr->row_buf + 1);
    uVar18 = png_ptr->transformations;
  }
  if (((uVar18 & 8) != 0) && (bVar7 = row_info->color_type, bVar7 != 3)) {
    bVar2 = row_info->bit_depth;
    uVar18 = (uint)bVar2;
    if ((bVar7 & 2) == 0) {
      bVar8 = (png_ptr->shift).gray;
      uVar25 = 1;
    }
    else {
      bVar8 = (png_ptr->shift).red;
      local_68[1] = (uint)(png_ptr->shift).green;
      local_58[1] = bVar2 - local_68[1];
      local_68[2] = (uint)(png_ptr->shift).blue;
      local_58[2] = bVar2 - local_68[2];
      uVar25 = 3;
    }
    ppVar4 = png_ptr->row_buf;
    local_58[0] = uVar18 - bVar8;
    local_68[0] = (uint)bVar8;
    if ((bVar7 & 4) != 0) {
      uVar19 = (uint)(png_ptr->shift).alpha;
      *(uint *)((long)local_58 + (ulong)(uVar25 * 4)) = bVar2 - uVar19;
      *(uint *)((long)local_68 + (ulong)(uVar25 * 4)) = uVar19;
      uVar25 = uVar25 + 1;
    }
    puVar21 = (ushort *)(ppVar4 + 1);
    local_38 = row_info;
    local_40 = png_ptr;
    if (bVar2 < 8) {
      sVar5 = row_info->rowbytes;
      pVar1 = (png_ptr->shift).gray;
      uVar25 = 0xff;
      if (pVar1 == '\x03' && bVar2 == 4) {
        uVar25 = 0x11;
      }
      uVar19 = 0x55;
      if (bVar2 != 2 || pVar1 != '\x01') {
        uVar19 = uVar25;
      }
      if (sVar5 != 0) {
        uVar25 = (uint)bVar8;
        sVar26 = 0;
        do {
          uVar17 = 0;
          bVar7 = 0;
          if (bVar2 != 0) {
            uVar16 = uVar18;
            iVar20 = bVar8 - uVar18;
            do {
              uVar27 = (byte)((byte)*puVar21 >> ((byte)iVar20 & 0x1f)) & uVar19;
              if (0 < (int)(uVar16 - uVar25)) {
                uVar27 = (uint)(byte)*puVar21 << ((byte)(uVar16 - uVar25) & 0x1f);
              }
              uVar17 = uVar17 | uVar27;
              bVar7 = (byte)uVar17;
              iVar20 = iVar20 + uVar25;
              uVar16 = uVar16 - uVar25;
            } while (0 < (int)uVar16);
          }
          *(byte *)puVar21 = bVar7;
          sVar26 = sVar26 + 1;
          puVar21 = (ushort *)((long)puVar21 + 1);
        } while (sVar26 != sVar5);
      }
    }
    else {
      uVar18 = row_info->width * uVar25;
      if (bVar2 == 8) {
        if (uVar18 != 0) {
          uVar19 = 0;
          do {
            uVar17 = 0;
            bVar7 = 0;
            uVar12 = (ulong)(uVar19 % uVar25 << 2);
            iVar20 = *(int *)((long)local_58 + uVar12);
            iVar15 = *(int *)((long)local_68 + uVar12);
            if (iVar20 != -iVar15 && SBORROW4(iVar20,-iVar15) == iVar20 + iVar15 < 0) {
              iVar13 = -iVar20;
              do {
                uVar16 = (uint)(byte)((byte)*puVar21 >> ((byte)iVar13 & 0x1f));
                if (0 < iVar20) {
                  uVar16 = (uint)(byte)*puVar21 << ((byte)iVar20 & 0x1f);
                }
                uVar17 = uVar17 | uVar16;
                bVar7 = (byte)uVar17;
                iVar13 = iVar13 + iVar15;
                bVar6 = 0 < iVar20;
                iVar20 = iVar20 - iVar15;
              } while (bVar6);
            }
            *(byte *)puVar21 = bVar7;
            uVar19 = uVar19 + 1;
            puVar21 = (ushort *)((long)puVar21 + 1);
          } while (uVar19 != uVar18);
        }
      }
      else if (uVar18 != 0) {
        uVar19 = 0;
        do {
          uVar12 = (ulong)(uVar19 % uVar25 << 2);
          iVar20 = *(int *)((long)local_58 + uVar12);
          iVar15 = *(int *)((long)local_68 + uVar12);
          uVar24 = 0;
          if (iVar20 != -iVar15 && SBORROW4(iVar20,-iVar15) == iVar20 + iVar15 < 0) {
            uVar11 = *puVar21 << 8 | *puVar21 >> 8;
            iVar13 = -iVar20;
            uVar17 = 0;
            do {
              uVar16 = (uint)(uVar11 >> ((byte)iVar13 & 0x1f));
              if (0 < iVar20) {
                uVar16 = (uint)uVar11 << ((byte)iVar20 & 0x1f);
              }
              uVar17 = uVar17 | uVar16;
              uVar24 = (ushort)uVar17;
              iVar13 = iVar13 + iVar15;
              bVar6 = 0 < iVar20;
              iVar20 = iVar20 - iVar15;
            } while (bVar6);
          }
          *puVar21 = uVar24 << 8 | uVar24 >> 8;
          puVar21 = puVar21 + 1;
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar18);
      }
    }
    uVar18 = png_ptr->transformations;
  }
  if ((uVar18 >> 0x11 & 1) != 0) {
    ppVar4 = png_ptr->row_buf;
    if (row_info->color_type == '\x04') {
      pVar3 = row_info->width;
      if (row_info->bit_depth == '\b') {
        if (pVar3 != 0) {
          lVar14 = 0;
          do {
            puVar21 = (ushort *)(ppVar4 + lVar14 * 2 + 1);
            *puVar21 = *puVar21 << 8 | *puVar21 >> 8;
            lVar14 = lVar14 + 1;
          } while (pVar3 != (png_uint_32)lVar14);
        }
      }
      else if (pVar3 != 0) {
        lVar14 = 0;
        do {
          auVar28 = pshuflw(ZEXT416(*(uint *)(ppVar4 + lVar14 * 4 + 1)),
                            ZEXT416(*(uint *)(ppVar4 + lVar14 * 4 + 1)),0xe1);
          *(int *)(ppVar4 + lVar14 * 4 + 1) = auVar28._0_4_;
          lVar14 = lVar14 + 1;
        } while (pVar3 != (png_uint_32)lVar14);
      }
    }
    else if (row_info->color_type == '\x06') {
      pVar3 = row_info->width;
      if (row_info->bit_depth == '\b') {
        if (pVar3 != 0) {
          lVar14 = 0;
          do {
            *(uint *)(ppVar4 + lVar14 * 4 + 1) =
                 *(uint *)(ppVar4 + lVar14 * 4 + 1) << 0x18 |
                 *(uint *)(ppVar4 + lVar14 * 4 + 1) >> 8;
            lVar14 = lVar14 + 1;
          } while (pVar3 != (png_uint_32)lVar14);
        }
      }
      else if (pVar3 != 0) {
        lVar14 = 0;
        do {
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(ppVar4 + lVar14 * 8 + 1);
          auVar28 = pshuflw(auVar28,auVar28,0x39);
          *(long *)(ppVar4 + lVar14 * 8 + 1) = auVar28._0_8_;
          lVar14 = lVar14 + 1;
        } while (pVar3 != (png_uint_32)lVar14);
      }
    }
  }
  if ((png_ptr->transformations & 0x80000) != 0) {
    ppVar4 = png_ptr->row_buf;
    if (row_info->color_type == '\x04') {
      pVar3 = row_info->width;
      if (row_info->bit_depth == '\b') {
        if (pVar3 != 0) {
          lVar14 = 0;
          do {
            ppVar4[lVar14 * 2 + 2] = ~ppVar4[lVar14 * 2 + 2];
            lVar14 = lVar14 + 1;
          } while (pVar3 != (png_uint_32)lVar14);
        }
      }
      else if (pVar3 != 0) {
        lVar14 = 0;
        do {
          ppVar4[lVar14 * 4 + 3] = ~ppVar4[lVar14 * 4 + 3];
          ppVar4[lVar14 * 4 + 4] = ~ppVar4[lVar14 * 4 + 4];
          lVar14 = lVar14 + 1;
        } while (pVar3 != (png_uint_32)lVar14);
      }
    }
    else if (row_info->color_type == '\x06') {
      pVar3 = row_info->width;
      if (row_info->bit_depth == '\b') {
        if (pVar3 != 0) {
          lVar14 = 0;
          do {
            ppVar4[lVar14 * 4 + 4] = ~ppVar4[lVar14 * 4 + 4];
            lVar14 = lVar14 + 1;
          } while (pVar3 != (png_uint_32)lVar14);
        }
      }
      else if (pVar3 != 0) {
        lVar14 = 0;
        do {
          ppVar4[lVar14 * 8 + 7] = ~ppVar4[lVar14 * 8 + 7];
          ppVar4[lVar14 * 8 + 8] = ~ppVar4[lVar14 * 8 + 8];
          lVar14 = lVar14 + 1;
        } while (pVar3 != (png_uint_32)lVar14);
      }
    }
  }
  uVar18 = png_ptr->transformations;
  if ((uVar18 & 1) != 0) {
    png_do_bgr(row_info,png_ptr->row_buf + 1);
    uVar18 = png_ptr->transformations;
  }
  if ((uVar18 & 0x20) == 0) {
    return;
  }
  png_do_invert(row_info,png_ptr->row_buf + 1);
  return;
LAB_0012027d:
  *pbVar22 = bVar7;
  goto LAB_00120280;
}

Assistant:

void /* PRIVATE */
png_do_write_transformations(png_structrp png_ptr, png_row_infop row_info)
{
   png_debug(1, "in png_do_write_transformations");

   if (png_ptr == NULL)
      return;

#ifdef PNG_WRITE_USER_TRANSFORM_SUPPORTED
   if ((png_ptr->transformations & PNG_USER_TRANSFORM) != 0)
      if (png_ptr->write_user_transform_fn != NULL)
         (*(png_ptr->write_user_transform_fn)) /* User write transform
                                                 function */
             (png_ptr,  /* png_ptr */
             row_info,  /* row_info: */
                /*  png_uint_32 width;       width of row */
                /*  size_t rowbytes;         number of bytes in row */
                /*  png_byte color_type;     color type of pixels */
                /*  png_byte bit_depth;      bit depth of samples */
                /*  png_byte channels;       number of channels (1-4) */
                /*  png_byte pixel_depth;    bits per pixel (depth*channels) */
             png_ptr->row_buf + 1);      /* start of pixel data for row */
#endif

#ifdef PNG_WRITE_FILLER_SUPPORTED
   if ((png_ptr->transformations & PNG_FILLER) != 0)
      png_do_strip_channel(row_info, png_ptr->row_buf + 1,
          !(png_ptr->flags & PNG_FLAG_FILLER_AFTER));
#endif

#ifdef PNG_WRITE_PACKSWAP_SUPPORTED
   if ((png_ptr->transformations & PNG_PACKSWAP) != 0)
      png_do_packswap(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_PACK_SUPPORTED
   if ((png_ptr->transformations & PNG_PACK) != 0)
      png_do_pack(row_info, png_ptr->row_buf + 1,
          (png_uint_32)png_ptr->bit_depth);
#endif

#ifdef PNG_WRITE_SWAP_SUPPORTED
#  ifdef PNG_16BIT_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_BYTES) != 0)
      png_do_swap(row_info, png_ptr->row_buf + 1);
#  endif
#endif

#ifdef PNG_WRITE_SHIFT_SUPPORTED
   if ((png_ptr->transformations & PNG_SHIFT) != 0)
      png_do_shift(row_info, png_ptr->row_buf + 1,
           &(png_ptr->shift));
#endif

#ifdef PNG_WRITE_SWAP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_ALPHA) != 0)
      png_do_write_swap_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_INVERT_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_ALPHA) != 0)
      png_do_write_invert_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_BGR_SUPPORTED
   if ((png_ptr->transformations & PNG_BGR) != 0)
      png_do_bgr(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_INVERT_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_MONO) != 0)
      png_do_invert(row_info, png_ptr->row_buf + 1);
#endif
}